

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::SanitizeForComment_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view str)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  byte local_41;
  const_iterator pvStack_40;
  uint8_t ch;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  undefined1 local_20 [8];
  string_view str_local;
  string *result;
  
  str_local._M_len = str._M_len;
  __range2._7_1_ = 0;
  local_20 = (undefined1  [8])this;
  str_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __begin2 = local_20;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  pvStack_40 = std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  for (; __end2 != pvStack_40; __end2 = __end2 + 1) {
    local_41 = *__end2;
    if ((((local_41 < 0x20) || (0x7e < local_41)) || (local_41 == 0x3f)) || (local_41 == 0x2f)) {
      StringPrintf_abi_cxx11_(&local_88,"%02X",(ulong)local_41);
      std::operator+(&local_68,"\\",&local_88);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_41);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string SanitizeForComment(std::string_view str) {
  std::string result;

  for (const uint8_t ch : str) {
    // escape control chars, DEL, >7-bit chars, trigraphs, and end of comment
    if (ch < ' ' || ch > '~' || ch == '?' || ch == '/') {
      result += "\\" + StringPrintf("%02X", ch);
    } else {
      result += ch;
    }
  }

  return result;
}